

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-s-parser.cpp
# Opt level: O2

Expression * __thiscall
wasm::SExpressionWasmBuilder::makeBrOnNull(SExpressionWasmBuilder *this,Element *s,bool onFail)

{
  Element *pEVar1;
  Expression *ref;
  BrOn *pBVar2;
  undefined7 in_register_00000011;
  Name name;
  Builder local_38;
  
  pEVar1 = Element::operator[](s,1);
  name = getLabel(this,pEVar1,Break);
  pEVar1 = Element::operator[](s,2);
  ref = parseExpression(this,pEVar1);
  local_38.wasm = this->wasm;
  pBVar2 = Builder::makeBrOn(&local_38,(BrOnOp)CONCAT71(in_register_00000011,onFail),name,ref,
                             (Type)0x0);
  return (Expression *)pBVar2;
}

Assistant:

Expression* SExpressionWasmBuilder::makeBrOnNull(Element& s, bool onFail) {
  int i = 1;
  auto name = getLabel(*s[i++]);
  auto* ref = parseExpression(*s[i]);
  auto op = onFail ? BrOnNonNull : BrOnNull;
  return Builder(wasm).makeBrOn(op, name, ref);
}